

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMNontrappingFPToIntLowering.cpp
# Opt level: O0

void __thiscall
wasm::LLVMNonTrappingFPToIntLoweringImpl::replaceSigned<double,int>
          (LLVMNonTrappingFPToIntLoweringImpl *this,Unary *curr)

{
  BinaryOp op;
  int iVar1;
  UnaryOp UVar2;
  Module *wasm;
  Function *func;
  LocalSet *value;
  Unary *pUVar3;
  Const *pCVar4;
  Binary *condition;
  LocalGet *value_00;
  If *expression;
  optional<wasm::Type> type;
  optional<wasm::Type> local_58;
  uintptr_t local_48;
  uintptr_t local_40;
  uintptr_t local_38;
  Index local_2c;
  Index v;
  Builder builder;
  UnaryOp absOp;
  BinaryOp ltOp;
  Unary *curr_local;
  LLVMNonTrappingFPToIntLoweringImpl *this_local;
  
  switch(curr->op) {
  case TruncSatSFloat32ToInt32:
  case TruncSatSFloat32ToInt64:
    builder.wasm._4_4_ = LtFloat32;
    builder.wasm._0_4_ = AbsFloat32;
    break;
  default:
    handle_unreachable("Unexpected opcode",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/LLVMNontrappingFPToIntLowering.cpp"
                       ,0x47);
  case TruncSatSFloat64ToInt32:
  case TruncSatSFloat64ToInt64:
    builder.wasm._4_4_ = LtFloat64;
    builder.wasm._0_4_ = AbsFloat64;
  }
  wasm = Walker<wasm::LLVMNonTrappingFPToIntLoweringImpl,_wasm::Visitor<wasm::LLVMNonTrappingFPToIntLoweringImpl,_void>_>
         ::getModule(&(this->
                      super_WalkerPass<wasm::PostWalker<wasm::LLVMNonTrappingFPToIntLoweringImpl,_wasm::Visitor<wasm::LLVMNonTrappingFPToIntLoweringImpl,_void>_>_>
                      ).
                      super_PostWalker<wasm::LLVMNonTrappingFPToIntLoweringImpl,_wasm::Visitor<wasm::LLVMNonTrappingFPToIntLoweringImpl,_void>_>
                      .
                      super_Walker<wasm::LLVMNonTrappingFPToIntLoweringImpl,_wasm::Visitor<wasm::LLVMNonTrappingFPToIntLoweringImpl,_void>_>
                    );
  Builder::Builder((Builder *)&stack0xffffffffffffffd8,wasm);
  func = Walker<wasm::LLVMNonTrappingFPToIntLoweringImpl,_wasm::Visitor<wasm::LLVMNonTrappingFPToIntLoweringImpl,_void>_>
         ::getFunction(&(this->
                        super_WalkerPass<wasm::PostWalker<wasm::LLVMNonTrappingFPToIntLoweringImpl,_wasm::Visitor<wasm::LLVMNonTrappingFPToIntLoweringImpl,_void>_>_>
                        ).
                        super_PostWalker<wasm::LLVMNonTrappingFPToIntLoweringImpl,_wasm::Visitor<wasm::LLVMNonTrappingFPToIntLoweringImpl,_void>_>
                        .
                        super_Walker<wasm::LLVMNonTrappingFPToIntLoweringImpl,_wasm::Visitor<wasm::LLVMNonTrappingFPToIntLoweringImpl,_void>_>
                      );
  local_38 = (curr->value->type).id;
  local_2c = Builder::addVar(func,(Type)local_38);
  op = builder.wasm._4_4_;
  UVar2 = (UnaryOp)builder.wasm;
  local_40 = (curr->value->type).id;
  value = Builder::makeLocalTee
                    ((Builder *)&stack0xffffffffffffffd8,local_2c,curr->value,(Type)local_40);
  pUVar3 = Builder::makeUnary((Builder *)&stack0xffffffffffffffd8,UVar2,(Expression *)value);
  iVar1 = std::numeric_limits<int>::max();
  pCVar4 = Builder::makeConst<double>((Builder *)&stack0xffffffffffffffd8,(double)iVar1);
  condition = Builder::makeBinary((Builder *)&stack0xffffffffffffffd8,op,(Expression *)pUVar3,
                                  (Expression *)pCVar4);
  UVar2 = getReplacementOp(this,curr->op);
  local_48 = (curr->value->type).id;
  value_00 = Builder::makeLocalGet((Builder *)&stack0xffffffffffffffd8,local_2c,(Type)local_48);
  pUVar3 = Builder::makeUnary((Builder *)&stack0xffffffffffffffd8,UVar2,(Expression *)value_00);
  iVar1 = std::numeric_limits<int>::min();
  pCVar4 = Builder::makeConst<int>((Builder *)&stack0xffffffffffffffd8,iVar1);
  std::optional<wasm::Type>::optional(&local_58);
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._9_7_ = 0;
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload =
       local_58.super__Optional_base<wasm::Type,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::Type>._M_payload;
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_engaged =
       local_58.super__Optional_base<wasm::Type,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::Type>._M_engaged;
  expression = Builder::makeIf((Builder *)&stack0xffffffffffffffd8,(Expression *)condition,
                               (Expression *)pUVar3,(Expression *)pCVar4,type);
  Walker<wasm::LLVMNonTrappingFPToIntLoweringImpl,_wasm::Visitor<wasm::LLVMNonTrappingFPToIntLoweringImpl,_void>_>
  ::replaceCurrent(&(this->
                    super_WalkerPass<wasm::PostWalker<wasm::LLVMNonTrappingFPToIntLoweringImpl,_wasm::Visitor<wasm::LLVMNonTrappingFPToIntLoweringImpl,_void>_>_>
                    ).
                    super_PostWalker<wasm::LLVMNonTrappingFPToIntLoweringImpl,_wasm::Visitor<wasm::LLVMNonTrappingFPToIntLoweringImpl,_void>_>
                    .
                    super_Walker<wasm::LLVMNonTrappingFPToIntLoweringImpl,_wasm::Visitor<wasm::LLVMNonTrappingFPToIntLoweringImpl,_void>_>
                   ,(Expression *)expression);
  return;
}

Assistant:

void replaceSigned(Unary* curr) {
    BinaryOp ltOp;
    UnaryOp absOp;
    switch (curr->op) {
      case TruncSatSFloat32ToInt32:
      case TruncSatSFloat32ToInt64:
        ltOp = LtFloat32;
        absOp = AbsFloat32;
        break;
      case TruncSatSFloat64ToInt32:
      case TruncSatSFloat64ToInt64:
        ltOp = LtFloat64;
        absOp = AbsFloat64;
        break;
      default:
        WASM_UNREACHABLE("Unexpected opcode");
    }

    Builder builder(*getModule());
    Index v = Builder::addVar(getFunction(), curr->value->type);
    // if fabs(operand) < INT_MAX then use the trapping operation, else return
    // INT_MIN. The altnernate value is correct for the case where the input is
    // INT_MIN itself; otherwise it's UB so any value will do.
    replaceCurrent(builder.makeIf(
      builder.makeBinary(
        ltOp,
        builder.makeUnary(
          absOp, builder.makeLocalTee(v, curr->value, curr->value->type)),
        builder.makeConst(static_cast<From>(std::numeric_limits<To>::max()))),
      builder.makeUnary(getReplacementOp(curr->op),
                        builder.makeLocalGet(v, curr->value->type)),
      builder.makeConst(std::numeric_limits<To>::min())));
  }